

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O1

void __thiscall fat::create_new_file(fat *this,string *file_path,string *fat_path)

{
  pointer *ppdVar1;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  int32_t *__src;
  char *pcVar5;
  undefined8 uVar6;
  undefined1 *puVar7;
  string *psVar8;
  pointer piVar9;
  fat *pfVar10;
  int32_t dir_cluster;
  FILE *pFVar11;
  undefined1 *puVar12;
  long lVar13;
  ulong uVar14;
  long *plVar15;
  boot_record *pbVar16;
  long lVar17;
  size_type *psVar18;
  short sVar19;
  int iVar20;
  ulong uVar21;
  int *piVar22;
  int iVar23;
  undefined8 __s1;
  string *__dest;
  short sVar24;
  undefined8 uStack_190;
  int aiStack_188 [2];
  char local_180 [8];
  directory root;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  undefined1 *local_118;
  string extension;
  string content;
  string cropped_file_name;
  string file_name;
  vector<fat::directory,_std::allocator<fat::directory>_> children;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string *local_60;
  vector<int,_std::allocator<int>_> local_58;
  undefined1 *local_40;
  fat *local_38;
  
  __dest = (string *)aiStack_188;
  piVar22 = aiStack_188;
  extension.field_2._M_local_buf[8] = 0x2f;
  uStack_190 = 0x105296;
  explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&name.field_2 + 8),(fat *)file_path,fat_path,extension.field_2._M_local_buf + 8)
  ;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  uStack_190 = 0x1052ba;
  pFVar11 = fopen((file_path->_M_dataplus)._M_p,"r");
  if (pFVar11 == (FILE *)0x0) {
    uStack_190 = 0x105bc2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FILE NOT FOUND",0xe);
    uStack_190 = 0x105bce;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    uStack_190 = 0x1052d9;
    local_60 = file_path;
    fseek(pFVar11,0,2);
    uStack_190 = 0x1052e1;
    puVar12 = (undefined1 *)ftell(pFVar11);
    uStack_190 = 0x1052f0;
    fseek(pFVar11,0,0);
    extension.field_2._8_8_ = &content._M_string_length;
    uStack_190 = 0x10530c;
    std::__cxx11::string::_M_construct((ulong)((long)&extension.field_2 + 8),(char)puVar12);
    uStack_190 = 0x105327;
    local_40 = puVar12;
    fread((void *)extension.field_2._8_8_,(size_t)puVar12,1,pFVar11);
    uStack_190 = 0x10532f;
    fclose(pFVar11);
    iVar20 = 0;
    iVar23 = (int)((ulong)content._M_dataplus._M_p / (ulong)(long)this->fs_br->cluster_size);
    local_38 = this;
    if (0 < iVar23) {
      do {
        uStack_190 = 0x105389;
        std::__cxx11::string::substr
                  ((ulong)(&cropped_file_name.field_2._M_allocated_capacity + 1),
                   (ulong)((long)&extension.field_2 + 8));
        uStack_190 = 0x105394;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (&cropped_file_name.field_2._M_allocated_capacity + 1));
        if ((size_type *)CONCAT44(cropped_file_name.field_2._12_4_,cropped_file_name.field_2._8_4_)
            != &file_name._M_string_length) {
          uStack_190 = 0x1053ac;
          operator_delete((undefined1 *)
                          CONCAT44(cropped_file_name.field_2._12_4_,cropped_file_name.field_2._8_4_)
                         );
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 < iVar23);
    }
    if ((ulong)content._M_dataplus._M_p % (ulong)(long)local_38->fs_br->cluster_size != 0) {
      uStack_190 = 0x1053f5;
      std::__cxx11::string::substr
                ((ulong)((long)&cropped_file_name.field_2 + 8),(ulong)((long)&extension.field_2 + 8)
                );
      uStack_190 = 0x105405;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cropped_file_name.field_2 + 8));
      if ((size_type *)CONCAT44(cropped_file_name.field_2._12_4_,cropped_file_name.field_2._8_4_) !=
          &file_name._M_string_length) {
        uStack_190 = 0x10541a;
        operator_delete((undefined1 *)
                        CONCAT44(cropped_file_name.field_2._12_4_,cropped_file_name.field_2._8_4_));
      }
    }
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar14 = 0;
    }
    else {
      uVar21 = 0;
      do {
        lVar17 = (long)local_38->fs_br->usable_cluster_count;
        lVar13 = 0;
        if (0 < lVar17) {
          lVar13 = 0;
          do {
            if (local_38->fat_table[lVar13] == local_38->FAT_UNUSED) {
              local_38->fat_table[lVar13] = local_38->FAT_FILE_END;
              goto LAB_00105479;
            }
            lVar13 = lVar13 + 1;
          } while (lVar17 != lVar13);
          lVar13 = 0;
        }
LAB_00105479:
        cropped_file_name.field_2._8_4_ = (undefined4)lVar13;
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          uStack_190 = 0x1054a0;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (int *)(cropped_file_name.field_2._M_local_buf + 8));
        }
        else {
          *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = cropped_file_name.field_2._8_4_;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar21 = uVar21 + 1;
        uVar14 = (long)local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
      } while (uVar21 < uVar14);
    }
    psVar8 = local_60;
    if ((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start >> 2 != uVar14) {
      uStack_190 = 0x105bef;
      __assert_fail("free_clusters.size() == split_content.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/honzaseda[P]ZOS/fat.cpp"
                    ,0x7a,"void fat::create_new_file(std::string, std::string)");
    }
    uStack_190 = 0x1054ee;
    std::__cxx11::string::find_last_of((char *)local_60,0x10a199,0xffffffffffffffff);
    uStack_190 = 0x105508;
    std::__cxx11::string::substr((ulong)((long)&cropped_file_name.field_2 + 8),(ulong)psVar8);
    pfVar10 = local_38;
    pcVar5 = cropped_file_name.field_2._M_local_buf + 8;
    uStack_190 = 0x10552e;
    std::__cxx11::string::find_last_of(pcVar5,0x10a04c,0xffffffffffffffff);
    uStack_190 = 0x105542;
    std::__cxx11::string::substr((ulong)&local_118,(ulong)pcVar5);
    uStack_190 = 0x10555c;
    std::__cxx11::string::substr((ulong)&root.size,(ulong)&local_118);
    if ((size_type *)local_118 != &extension._M_string_length) {
      uStack_190 = 0x105571;
      operator_delete(local_118);
    }
    uStack_190 = 0x10558c;
    std::__cxx11::string::find_last_of(pcVar5,0x10a04c,0xffffffffffffffff);
    uStack_190 = 0x1055a6;
    std::__cxx11::string::substr((ulong)((long)&content.field_2 + 8),(ulong)pcVar5);
    uStack_190 = 0x1055c0;
    std::__cxx11::string::substr((ulong)&local_118,(ulong)((long)&content.field_2 + 8));
    if ((size_type *)content.field_2._8_8_ != &cropped_file_name._M_string_length) {
      uStack_190 = 0x1055d5;
      operator_delete((void *)content.field_2._8_8_);
    }
    ppdVar1 = &children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uStack_190 = 0x1055fa;
    file_name.field_2._8_8_ = ppdVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&file_name.field_2 + 8),root._16_8_,
               name._M_dataplus._M_p + root._16_8_);
    uStack_190 = 0x10560d;
    std::__cxx11::string::append(file_name.field_2._M_local_buf + 8);
    uStack_190 = 0x105627;
    plVar15 = (long *)std::__cxx11::string::_M_append
                                (file_name.field_2._M_local_buf + 8,(ulong)local_118);
    puVar12 = local_40;
    psVar18 = (size_type *)(plVar15 + 2);
    if ((size_type *)*plVar15 == psVar18) {
      cropped_file_name._M_string_length = *psVar18;
      cropped_file_name.field_2._M_allocated_capacity = plVar15[3];
      content.field_2._8_8_ = &cropped_file_name._M_string_length;
    }
    else {
      cropped_file_name._M_string_length = *psVar18;
      content.field_2._8_8_ = (size_type *)*plVar15;
    }
    cropped_file_name._M_dataplus._M_p = (pointer)plVar15[1];
    *plVar15 = (long)psVar18;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    if ((pointer *)file_name.field_2._8_8_ != ppdVar1) {
      uStack_190 = 0x105686;
      operator_delete((void *)file_name.field_2._8_8_);
    }
    local_180[0] = '\0';
    local_180[1] = '\0';
    local_180[2] = '\0';
    local_180[3] = '\0';
    local_180[4] = '\0';
    local_180[5] = '\0';
    local_180[6] = '\0';
    local_180[7] = '\0';
    root.name[0] = '\0';
    root.name[1] = '\0';
    root.name[2] = '\0';
    root.name[3] = '\0';
    root.name[4] = '\0';
    root.name[5] = '\x01';
    uStack_190 = 0x1056aa;
    strcpy(local_180,(char *)content.field_2._8_8_);
    root.name._8_4_ = SUB84(puVar12,0);
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      uStack_190 = 0x105c01;
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    else {
      root._12_4_ = *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uStack_190 = 0x1056d7;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&result.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&name.field_2 + 8));
      uStack_190 = 0x1056e6;
      dir_cluster = get_parent_cluster(pfVar10,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)&result.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                      );
      uStack_190 = 0x1056f5;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&result.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (-1 < dir_cluster) {
        uStack_190 = 0x105710;
        get_dir_children((vector<fat::directory,_std::allocator<fat::directory>_> *)
                         ((long)&file_name.field_2 + 8),pfVar10,dir_cluster);
        uVar6 = content.field_2._8_8_;
        local_60 = (string *)CONCAT44(local_60._4_4_,dir_cluster);
        pbVar16 = pfVar10->fs_br;
        puVar12 = (undefined1 *)(long)pbVar16->cluster_size;
        uVar14 = ((long)children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>
                        ._M_impl.super__Vector_impl_data._M_start - file_name.field_2._8_8_ >> 3) *
                 -0x5555555555555555;
        if (uVar14 < (ulong)puVar12 / 0x18) {
          local_40 = puVar12;
          if (children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)file_name.field_2._8_8_) {
            lVar13 = uVar14 + (uVar14 == 0);
            __s1 = file_name.field_2._8_8_;
            do {
              uStack_190 = 0x10577c;
              iVar20 = strcmp((char *)__s1,(char *)uVar6);
              if ((iVar20 == 0) && (*(char *)(__s1 + 0xd) == '\x01')) goto LAB_00105b7c;
              __s1 = __s1 + 0x18;
              lVar13 = lVar13 + -1;
            } while (lVar13 != 0);
          }
          pfVar10 = local_38;
          uStack_190 = 0x1057cc;
          fseek((FILE *)local_38->fs,
                (long)(int)local_60 * (long)local_40 +
                (long)pbVar16->usable_cluster_count * (long)pbVar16->fat_copies * 4 + 0x110,0);
          if (children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)file_name.field_2._8_8_) {
            sVar19 = 0x18;
          }
          else {
            lVar13 = 0;
            uVar14 = 0;
            do {
              uStack_190 = 0x1057f8;
              fwrite((void *)(file_name.field_2._8_8_ + lVar13),0x18,1,(FILE *)pfVar10->fs);
              uVar14 = uVar14 + 1;
              uVar21 = ((long)children.
                              super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
                              _M_impl.super__Vector_impl_data._M_start - file_name.field_2._8_8_ >>
                       3) * -0x5555555555555555;
              lVar13 = lVar13 + 0x18;
            } while (uVar14 <= uVar21 && uVar21 - uVar14 != 0);
            sVar19 = (short)lVar13 + 0x18;
          }
          uStack_190 = 0x105841;
          fwrite(local_180,0x18,1,(FILE *)pfVar10->fs);
          pbVar16 = pfVar10->fs_br;
          if (sVar19 < pbVar16->cluster_size) {
            sVar24 = 1;
            do {
              uStack_190 = 0x105863;
              fputc(0,(FILE *)pfVar10->fs);
              iVar20 = (int)sVar24;
              pbVar16 = pfVar10->fs_br;
              sVar24 = sVar24 + 1;
            } while (iVar20 < (int)pbVar16->cluster_size - (int)sVar19);
          }
          uVar4 = pbVar16->usable_cluster_count;
          lVar13 = -((ulong)uVar4 * 4 + 0xf & 0xfffffffffffffff0);
          __dest = (string *)((long)aiStack_188 + lVar13);
          lVar17 = (long)pfVar10->fs_br->usable_cluster_count;
          if (0 < lVar17) {
            __src = pfVar10->fat_table;
            *(undefined8 *)((long)aiStack_188 + lVar13 + -8) = 0x1058bd;
            memcpy(__dest,__src,lVar17 << 2);
          }
          piVar9 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            uVar14 = (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            iVar20 = pfVar10->FAT_FILE_END;
            uVar21 = 1;
            do {
              iVar23 = iVar20;
              if (uVar14 != uVar21) {
                if (uVar14 <= uVar21) goto LAB_00105b6e;
                iVar23 = piVar9[uVar21];
              }
              *(int *)((long)__dest + (long)piVar9[uVar21 - 1] * 4) = iVar23;
              lVar17 = (-(ulong)(uVar14 == 0) - uVar14) + uVar21;
              uVar21 = uVar21 + 1;
            } while (lVar17 != 0);
          }
          pFVar11 = (FILE *)pfVar10->fs;
          iVar20 = 0;
          local_40 = (undefined1 *)aiStack_188;
          *(undefined8 *)((long)aiStack_188 + lVar13 + -8) = 0x105923;
          fseek(pFVar11,0x110,0);
          if ('\0' < pfVar10->fs_br->fat_copies) {
            do {
              pFVar11 = (FILE *)pfVar10->fs;
              *(undefined8 *)((long)aiStack_188 + lVar13 + -8) = 0x10594a;
              fwrite(__dest,(ulong)uVar4 << 2,1,pFVar11);
              iVar20 = iVar20 + 1;
            } while (iVar20 < pfVar10->fs_br->fat_copies);
          }
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish !=
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start) {
            lVar13 = 0;
            uVar14 = 0;
            local_60 = __dest;
            do {
              uVar3 = pfVar10->fs_br->cluster_size;
              __dest = (string *)((long)local_60 - (ulong)(uVar3 + 0xf & 0xfffffff0));
              *(char *)((long)__dest + -8) = -0x5e;
              *(char *)((long)__dest + -7) = 'Y';
              *(char *)((long)__dest + -6) = '\x10';
              *(char *)((long)__dest + -5) = '\0';
              *(char *)((long)__dest + -4) = '\0';
              *(char *)((long)__dest + -3) = '\0';
              *(char *)((long)__dest + -2) = '\0';
              *(char *)((long)__dest + -1) = '\0';
              memset(__dest,0,(ulong)uVar3);
              if ((ulong)((long)local_78.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_78.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
LAB_00105b5d:
                builtin_strncpy((char *)((long)__dest + -8),"n[\x10",4);
                *(char *)((long)__dest + -4) = '\0';
                *(char *)((long)__dest + -3) = '\0';
                *(char *)((long)__dest + -2) = '\0';
                *(char *)((long)__dest + -1) = '\0';
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar14);
LAB_00105b6e:
                builtin_strncpy((char *)((long)__dest + -8),"|[\x10",4);
                *(char *)((long)__dest + -4) = '\0';
                *(char *)((long)__dest + -3) = '\0';
                *(char *)((long)__dest + -2) = '\0';
                *(char *)((long)__dest + -1) = '\0';
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
LAB_00105b7c:
                *(undefined8 *)((long)__dest + -8) = 0x105b94;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"NAME ALREADY EXISTS",0x13);
                *(undefined8 *)((long)__dest + -8) = 0x105ba0;
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                piVar22 = (int *)__dest;
                goto LAB_00105ba0;
              }
              pcVar5 = *(char **)((long)&((local_78.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar13);
              *(char *)((long)__dest + -8) = -0x3a;
              *(char *)((long)__dest + -7) = 'Y';
              *(char *)((long)__dest + -6) = '\x10';
              *(char *)((long)__dest + -5) = '\0';
              *(char *)((long)__dest + -4) = '\0';
              *(char *)((long)__dest + -3) = '\0';
              *(char *)((long)__dest + -2) = '\0';
              *(char *)((long)__dest + -1) = '\0';
              strcpy((char *)__dest,pcVar5);
              pFVar11 = (FILE *)pfVar10->fs;
              cVar2 = pfVar10->fs_br->fat_copies;
              iVar20 = pfVar10->fs_br->usable_cluster_count;
              *(char *)((long)__dest + -8) = -0x10;
              *(char *)((long)__dest + -7) = 'Y';
              *(char *)((long)__dest + -6) = '\x10';
              *(char *)((long)__dest + -5) = '\0';
              *(char *)((long)__dest + -4) = '\0';
              *(char *)((long)__dest + -3) = '\0';
              *(char *)((long)__dest + -2) = '\0';
              *(char *)((long)__dest + -1) = '\0';
              fseek(pFVar11,(long)iVar20 * (long)cVar2 * 4 + 0x110,0);
              if ((ulong)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2) <= uVar14) goto LAB_00105b5d;
              pFVar11 = (FILE *)pfVar10->fs;
              sVar19 = pfVar10->fs_br->cluster_size;
              iVar20 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
              builtin_strncpy((char *)((long)__dest + -8),"*Z\x10",4);
              *(char *)((long)__dest + -4) = '\0';
              *(char *)((long)__dest + -3) = '\0';
              *(char *)((long)__dest + -2) = '\0';
              *(char *)((long)__dest + -1) = '\0';
              fseek(pFVar11,(long)iVar20 * (long)sVar19,1);
              pFVar11 = (FILE *)pfVar10->fs;
              builtin_strncpy((char *)((long)__dest + -8),">Z\x10",4);
              *(char *)((long)__dest + -4) = '\0';
              *(char *)((long)__dest + -3) = '\0';
              *(char *)((long)__dest + -2) = '\0';
              *(char *)((long)__dest + -1) = '\0';
              fwrite(__dest,(ulong)uVar3,1,pFVar11);
              uVar14 = uVar14 + 1;
              lVar13 = lVar13 + 0x20;
              __dest = local_60;
            } while (uVar14 < (ulong)((long)local_58.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 2));
          }
          *(undefined8 *)((long)&__dest[-1].field_2 + 8) = 0x105a79;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
          uVar6 = *(undefined8 *)(std::cout + -0x18);
          *(undefined8 *)((long)&__dest[-1].field_2 + 8) = 0x105a8d;
          std::ios::widen((char)uVar6 + '(');
          *(undefined8 *)((long)&__dest[-1].field_2 + 8) = 0x105a9c;
          std::ostream::put('(');
          *(undefined8 *)((long)&__dest[-1].field_2 + 8) = 0x105aa4;
          std::ostream::flush();
          puVar12 = local_40;
          uVar6 = file_name.field_2._8_8_;
          if (file_name.field_2._8_8_ != 0) {
            *(undefined8 *)(local_40 + -8) = 0x105ac7;
            operator_delete((void *)uVar6);
          }
          uVar6 = content.field_2._8_8_;
          if ((size_type *)content.field_2._8_8_ != &cropped_file_name._M_string_length) {
            *(undefined8 *)(puVar12 + -8) = 0x105ad8;
            operator_delete((void *)uVar6);
          }
          if ((size_type *)local_118 != &extension._M_string_length) {
            *(undefined8 *)(puVar12 + -8) = 0x105ae9;
            operator_delete(local_118);
          }
          if ((size_type *)root._16_8_ != &name._M_string_length) {
            *(undefined8 *)(puVar12 + -8) = 0x105afe;
            operator_delete((void *)root._16_8_);
          }
          puVar7 = (undefined1 *)
                   CONCAT44(cropped_file_name.field_2._12_4_,cropped_file_name.field_2._8_4_);
          if ((size_type *)puVar7 != &file_name._M_string_length) {
            *(undefined8 *)(puVar12 + -8) = 0x105b13;
            operator_delete(puVar7);
          }
          uVar6 = extension.field_2._8_8_;
          if ((size_type *)extension.field_2._8_8_ != &content._M_string_length) {
            *(undefined8 *)(puVar12 + -8) = 0x105b2b;
            operator_delete((void *)uVar6);
          }
          piVar9 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (int *)0x0) {
            *(undefined8 *)(puVar12 + -8) = 0x105b39;
            operator_delete(piVar9);
          }
          *(undefined8 *)(puVar12 + -8) = 0x105b42;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
          *(undefined8 *)(puVar12 + -8) = 0x105b4e;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&name.field_2 + 8));
          return;
        }
        uStack_190 = 0x105c42;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"DIRECTORY IS FULL",0x11);
        uStack_190 = 0x105c4e;
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        piVar22 = aiStack_188;
        goto LAB_00105ba0;
      }
    }
    uStack_190 = 0x105c19;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PATH NOT FOUND",0xe);
    uStack_190 = 0x105c25;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    piVar22 = aiStack_188;
  }
LAB_00105ba0:
  *(undefined8 *)((long)piVar22 + -8) = 0x105baa;
  exit(1);
}

Assistant:

void fat::create_new_file(std::string file_path, std::string fat_path) {
    FILE *fnew;
    std::vector<std::string> result = explode(fat_path, '/');

    struct directory root;
    std::vector<std::string> split_content = std::vector<std::string>();
    std::vector<int32_t> free_clusters = std::vector<int32_t>();

    // ---
    // Reading the input file and storing its content into a string vector
    // ---
    if((fnew = fopen(file_path.c_str(), "r")) == NULL){
        std::cout << "FILE NOT FOUND" << std::endl;
        exit(1);
    }
    fseek(fnew, 0, SEEK_END);
    long fsize = ftell(fnew);
    fseek(fnew, 0, SEEK_SET);
    std::string content(fsize, '\0');
    fread(&content[0], fsize, 1, fnew);
    fclose(fnew);
    int NumSubstrings = content.length() / fs_br->cluster_size;
    for (auto i = 0; i < NumSubstrings; i++) {
        split_content.push_back(content.substr(i * fs_br->cluster_size, fs_br->cluster_size));
    }
    if (content.length() % fs_br->cluster_size != 0) {
        split_content.push_back(content.substr(fs_br->cluster_size * NumSubstrings));
    }

    for (int i = 0; i < split_content.size(); i++) {
        free_clusters.push_back(get_first_free_cluster());
    }
    assert(free_clusters.size() == split_content.size());

    // ---
    // Updating the parent directory content
    // ---
    std::string file_name = file_path.substr(file_path.find_last_of("/") + 1);
    std::string name = file_name.substr(0, file_name.find_last_of(".")).substr(0,8);
    std::string extension = file_name.substr(file_name.find_last_of(".") + 1).substr(0,3);
    std::string cropped_file_name = name + "." + extension;

    memset(root.name, '\0', sizeof(root.name));
    root.is_file = 1;
    strcpy(root.name, cropped_file_name.c_str());
    root.size = fsize;
    root.start_cluster = free_clusters.at(0);

    int32_t parent = get_parent_cluster(result);
    if (parent < 0) {
        std::cout << "PATH NOT FOUND" << std::endl;
        exit(1);
    }
    std::vector<fat::directory> children = get_dir_children(parent);
    long max_cluster_dirs = fs_br->cluster_size / sizeof(struct directory);
    if(children.size() >= max_cluster_dirs){
        std::cout << "DIRECTORY IS FULL" << std::endl;
        exit(1);
    }
    for(int i = 0; i < children.size(); i++){
        if((strcmp(children.at(i).name, cropped_file_name.c_str()) == 0) && children.at(i).is_file){
            std::cout << "NAME ALREADY EXISTS" << std::endl;
            exit(1);
        }
    }
    fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count) +
               parent * fs_br->cluster_size), SEEK_SET);
    int16_t ac_size = 0;
    for (int j = 0; j < children.size(); j++) {
        fwrite(&children.at(j), sizeof(directory), 1, fs);
        ac_size += sizeof(directory);
    }
    fwrite(&root, sizeof(root), 1, fs);
    ac_size += sizeof(directory);
    char buffer[] = {'\0'};
    for (int16_t i = 0; i < (fs_br->cluster_size - ac_size); i++) {
        fwrite(buffer, sizeof(buffer), 1, fs);
    }

    // ---
    // Updating all FAT table copies
    // ---
    int32_t new_fat[fs_br->usable_cluster_count];
    for (int k = 0; k < fs_br->usable_cluster_count; k++) {
        new_fat[k] = fat_table[k];
    }
    for (int x = 0; x < free_clusters.size(); x++) {
        if (x != free_clusters.size() - 1) {
            new_fat[free_clusters.at(x)] = free_clusters.at(x + 1);
        } else {
            new_fat[free_clusters.at(x)] = FAT_FILE_END;
        }
    }
    fseek(fs, sizeof(boot_record), SEEK_SET);
    for (int i = 0; i < fs_br->fat_copies; i++) {
        fwrite(&new_fat, sizeof(new_fat), 1, fs);
    }

    // ---
    // Inserting the input file content into FAT clusters
    // ---
    for (int i = 0; i < free_clusters.size(); i++) {
        char cluster[fs_br->cluster_size];
        memset(cluster, '\0', sizeof(cluster));
        strcpy(cluster, split_content.at(i).c_str());

        fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count)),
              SEEK_SET);
        fseek(fs, fs_br->cluster_size * free_clusters.at(i), SEEK_CUR);
        fwrite(&cluster, sizeof(cluster), 1, fs);
    }
    std::cout << "OK" << std::endl;
}